

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O1

void Llb_ManPrintHisto(Llb_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iGroup;
  ulong uVar4;
  
  pVVar2 = p->pAig->vObjs;
  if (0 < pVVar2->nSize) {
    uVar4 = 0;
    do {
      if (pVVar2->pArray[uVar4] != (void *)0x0) {
        if ((long)p->vObj2Var->nSize <= (long)uVar4) {
LAB_00924da6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (-1 < p->vObj2Var->pArray[uVar4]) {
          printf("%3d :",uVar4 & 0xffffffff);
          pVVar3 = p->vVarBegs;
          if ((long)pVVar3->nSize <= (long)uVar4) goto LAB_00924da6;
          iGroup = 0;
          while (iGroup < pVVar3->pArray[uVar4]) {
            putchar(0x20);
            iGroup = iGroup + 1;
            pVVar3 = p->vVarBegs;
            if ((long)pVVar3->nSize <= (long)uVar4) goto LAB_00924da6;
          }
          while( true ) {
            if ((long)p->vVarEnds->nSize <= (long)uVar4) goto LAB_00924da6;
            if (p->vVarEnds->pArray[uVar4] < iGroup) break;
            iVar1 = Llb_ManGroupHasVar(p,iGroup,(int)uVar4);
            putchar((uint)(iVar1 == 0) * 3 + 0x2a);
            iGroup = iGroup + 1;
          }
          putchar(10);
        }
      }
      uVar4 = uVar4 + 1;
      pVVar2 = p->pAig->vObjs;
    } while ((long)uVar4 < (long)pVVar2->nSize);
  }
  return;
}

Assistant:

void Llb_ManPrintHisto( Llb_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( Vec_IntEntry(p->vObj2Var, i) < 0 )
            continue;
        printf( "%3d :", i );
        for ( k = 0; k < Vec_IntEntry(p->vVarBegs, i); k++ )
            printf( " " );
        for (      ; k <= Vec_IntEntry(p->vVarEnds, i); k++ )
            printf( "%c", Llb_ManGroupHasVar(p, k, i)? '*':'-' );
        printf( "\n" );
    }
}